

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

Matrix<float,_4,_2> * __thiscall
vkt::sr::(anonymous_namespace)::MatrixCaseUtils::increment<float,4,2>
          (Matrix<float,_4,_2> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_4,_2> *mat)

{
  long lVar1;
  
  tcu::Matrix<float,_4,_2>::Matrix(__return_storage_ptr__);
  for (lVar1 = -0x10; lVar1 != 0; lVar1 = lVar1 + 4) {
    *(float *)((long)(__return_storage_ptr__->m_data).m_data[1].m_data + lVar1) =
         *(float *)(this + lVar1 + 0x10) + 1.0;
    *(float *)((long)__return_storage_ptr__[1].m_data.m_data[0].m_data + lVar1) =
         *(float *)(this + lVar1 + 0x20) + 1.0;
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::Matrix<T, Rows, Cols> increment (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) + 1.0f;

	return retVal;
}